

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

int __thiscall Sudoku::doplnM(Sudoku *this,int x,int y,int cislo)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  
  if (((uint)y < 9 && (uint)x < 9) && (uVar2 = y * 9 + x, ((uint)(this->s).pole[uVar2] & 0x10) == 0)
     ) {
    uVar3 = (ulong)(uint)y;
    uVar4 = (ulong)(uint)x;
    puVar5 = (this->s).ctverce[uVar4 / 3] + uVar3 / 3;
    uVar6 = 1 << ((byte)cislo & 0x1f);
    if ((((this->s).sloupce[uVar4] | (this->s).radky[uVar3] | *puVar5) >> (cislo & 0x1fU) & 1) != 0)
    {
      (this->s).rozbite = 1;
    }
    *(byte *)((this->s).pole + uVar2) = *(byte *)((this->s).pole + uVar2) & 0xf0 | (byte)cislo & 0xf
    ;
    puVar1 = (this->s).radky + uVar3;
    *puVar1 = *puVar1 | uVar6;
    puVar1 = (this->s).sloupce + uVar4;
    *puVar1 = *puVar1 | uVar6;
    *puVar5 = *puVar5 | uVar6;
    puVar5 = &(this->s).doplnenych;
    *puVar5 = *puVar5 + 1;
  }
  return 0;
}

Assistant:

int Sudoku::doplnM (int x, int y, int cislo)
{
  // jsme v mezich hraciho pole?
  if(0 <= x && x < 9)
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// neprepisujeme pevna cisla
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3]; // prusecik mnozin zakazanych hodnot
      if(!((1 << cislo) & ~zakazano)) // je zakazano doplnit cislo na policko?
      {
        s.rozbite = true; // doplnujeme manualne, tudiz toto vede k doplneni a neplatnosti hraci plochy
      }
      s.pole[y*9+x].zapsane = cislo;// zapiseme cislo na uvedenou pozici
      // zakazeme pouzit cislo v radku, sloupci a ctverci
      s.radky[y] |= (1 << cislo);
      s.sloupce[x] |= (1 << cislo);
      s.ctverce[x/3][y/3] |= (1 << cislo);
      s.doplnenych++;
    }
  return false;
}